

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::Matcher
          (Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> *this,
          pair<phmap::priv::hash_internal::EnumClass,_int> *value)

{
  undefined8 extraout_RDX;
  EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_> EVar1;
  pair<phmap::priv::hash_internal::EnumClass,_int> x;
  EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_> local_40;
  Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> local_30;
  pair<phmap::priv::hash_internal::EnumClass,_int> *local_18;
  pair<phmap::priv::hash_internal::EnumClass,_int> *value_local;
  Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> *this_local;
  
  local_18 = value;
  value_local = (pair<phmap::priv::hash_internal::EnumClass,_int> *)this;
  internal::MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::MatcherBase
            (&this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>
            );
  (this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_00497270;
  x.first = *(EnumClass *)&local_18->second & 0xffffffff;
  x._8_8_ = extraout_RDX;
  EVar1 = Eq<std::pair<phmap::priv::hash_internal::EnumClass,int>>((testing *)local_18->first,x);
  local_40.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>,_std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::equal_to<void>_>
  .rhs_.first = EVar1.
                super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>,_std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::equal_to<void>_>
                .rhs_.first;
  local_40.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>,_std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::equal_to<void>_>
  .rhs_.second = EVar1.
                 super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>,_std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::equal_to<void>_>
                 .rhs_.second;
  Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>::
  Matcher<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,int>>,void>
            ((Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&> *)&local_30,
             &local_40);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}